

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLineBspline::ChLineBspline(ChLineBspline *this)

{
  initializer_list<chrono::ChVector<double>_> __l;
  allocator_type local_61;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> mpoints;
  undefined1 local_48 [24];
  undefined8 local_30;
  undefined1 local_28 [16];
  
  (this->super_ChLine).closed = false;
  (this->super_ChLine).complexityU = 2;
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChLineBspline_0118a050;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_48._8_16_ = ZEXT416(0) << 0x40;
  local_48._0_8_ = &DAT_bff0000000000000;
  local_30 = 0x3ff0000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_48;
  local_28 = local_48._8_16_;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&mpoints,__l,&local_61);
  this->closed = false;
  (*(this->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x15])(this,1,&mpoints,0);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&mpoints.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               );
  return;
}

Assistant:

ChLineBspline::ChLineBspline() {
    const std::vector<ChVector<> > mpoints = {ChVector<>(-1, 0, 0), ChVector<>(1, 0, 0)};
	this->closed = false;
    this->SetupData(1, mpoints);
}